

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.h
# Opt level: O3

void * __thiscall ChunkedStackPool<65532>::Allocate(ChunkedStackPool<65532> *this,uint bytes)

{
  uint uVar1;
  StackChunk *pSVar2;
  uint uVar3;
  
  uVar3 = bytes + 7 & 0xfffffff8;
  if (0xfffc < uVar3) {
    __assert_fail("bytes <= chunkSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Pool.h",
                  0x37,"void *ChunkedStackPool<65532>::Allocate(unsigned int) [chunkSize = 65532]");
  }
  uVar1 = this->size + uVar3;
  if (uVar1 < 0xfffd) {
    this->size = uVar1;
    pSVar2 = (StackChunk *)((long)this->curr + ((ulong)uVar1 - (ulong)uVar3));
    goto LAB_00214128;
  }
  if (this->curr == (StackChunk *)0x0) {
    pSVar2 = (StackChunk *)(*(code *)NULLC::alloc)(0x10008);
    this->first = pSVar2;
LAB_00214119:
    this->curr = pSVar2;
    pSVar2->next = (StackChunk *)0x0;
  }
  else {
    pSVar2 = this->curr->next;
    if (pSVar2 == (StackChunk *)0x0) {
      pSVar2 = (StackChunk *)(*(code *)NULLC::alloc)(0x10008);
      this->curr->next = pSVar2;
      goto LAB_00214119;
    }
    this->curr = pSVar2;
  }
  this->size = uVar3;
LAB_00214128:
  return pSVar2->data;
}

Assistant:

void*	Allocate(unsigned int bytes)
	{
		bytes = (bytes + 7) & ~7; // 8-byte align

		assert(bytes <= chunkSize);
		if(size + bytes <= chunkSize)
		{
			size += bytes;
			return curr->data + size - bytes;
		}
		if(curr && curr->next)
		{
			curr = curr->next;
			size = bytes;
			return curr->data;
		}
		if(curr)
		{
			curr->next = new(NULLC::alloc(sizeof(StackChunk))) StackChunk;
			curr = curr->next;
			curr->next = NULL;
		}else{
			curr = first = new(NULLC::alloc(sizeof(StackChunk))) StackChunk;
			curr->next = NULL;
		}
		size = bytes;
		return curr->data;
	}